

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
                   idx_t idx)

{
  idx_t iVar1;
  idx_t iVar2;
  string_t *input;
  char *__dest;
  ulong input_size;
  char *data_ptr;
  ulong __n;
  string_t sVar3;
  anon_union_16_2_67f50693_for_value local_90 [2];
  string_t local_70;
  string sep;
  anon_union_16_2_67f50693_for_value local_40;
  undefined8 local_30;
  char *local_28;
  
  local_40.pointer.ptr = (char *)right.value._8_8_;
  local_40._0_8_ = right.value._0_8_;
  local_28 = left.value._8_8_;
  data_ptr = local_28;
  if (left.value._0_4_ < 0xd) {
    data_ptr = (char *)((long)&local_30 + 4);
  }
  local_30 = left.value._0_8_;
  string_t::GetString_abi_cxx11_((string *)&local_90[0].pointer,(string_t *)&local_40.pointer);
  string_t::string_t(&local_70,(string *)&local_90[0].pointer);
  GetSeparator_abi_cxx11_(&sep,(duckdb *)&local_70,input);
  input_size = left.value._0_8_ & 0xffffffff;
  std::__cxx11::string::~string((string *)&local_90[0].pointer);
  iVar1 = FindLast(data_ptr,input_size,&sep);
  iVar2 = 1;
  if (left.value._0_4_ != 1) {
    iVar2 = iVar1;
  }
  if (iVar1 != 0) {
    iVar2 = iVar1;
  }
  __n = 0;
  if (iVar2 <= input_size) {
    __n = iVar2;
  }
  local_90[0] = (anon_union_16_2_67f50693_for_value)
                duckdb::StringVector::EmptyString(fun.result,__n);
  __dest = local_90[0].pointer.ptr;
  if (local_90[0].pointer.length < 0xd) {
    __dest = local_90[0].pointer.prefix;
  }
  memcpy(__dest,data_ptr,__n);
  string_t::Finalize((string_t *)&local_90[0].pointer);
  sVar3.value = (anon_union_16_2_67f50693_for_value)
                duckdb::StringVector::AddString(fun.result,(string_t)local_90[0].pointer);
  std::__cxx11::string::~string((string *)&sep);
  return (string_t)sVar3.value;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}